

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::NamedMaterial(BasicSceneBuilder *this,string *origName,FileLoc loc)

{
  string *in_RSI;
  long in_RDI;
  string *in_stack_00000018;
  string name;
  string local_50 [16];
  char (*in_stack_ffffffffffffffc0) [14];
  char *in_stack_ffffffffffffffc8;
  FileLoc *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string(local_50,in_RSI);
  NormalizeUTF8(in_stack_00000018);
  std::__cxx11::string::~string(local_50);
  if (*(int *)(in_RDI + 0x18) == 0) {
    ErrorExit<char_const(&)[14]>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0x68),(string *)&stack0xffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void BasicSceneBuilder::NamedMaterial(const std::string &origName, FileLoc loc) {
    std::string name = NormalizeUTF8(origName);
    VERIFY_WORLD("NamedMaterial");
    graphicsState.currentMaterialName = name;
    graphicsState.currentMaterialIndex = -1;
}